

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::Classifier::Classifier
          (Classifier *this,string *suffix,CompressorScheme scheme,PixelType type,int cscIdx,
          bool caseInsensitive)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  undefined3 in_register_00000089;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)this,(string *)suffix);
  this->_scheme = scheme;
  this->_type = type;
  this->_cscIdx = cscIdx;
  this->_caseInsensitive = caseInsensitive;
  if (CONCAT31(in_register_00000089,caseInsensitive) != 0) {
    pcVar1 = (this->_suffix)._M_dataplus._M_p;
    sVar2 = (this->_suffix)._M_string_length;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      iVar3 = tolower((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
    }
  }
  return;
}

Assistant:

Classifier (std::string suffix,
                CompressorScheme scheme,
                PixelType type,
                int cscIdx,
                bool caseInsensitive):
        _suffix(suffix),
        _scheme(scheme),
        _type(type),
        _cscIdx(cscIdx),
        _caseInsensitive(caseInsensitive)
    {
        if (caseInsensitive) 
            std::transform(_suffix.begin(), _suffix.end(), _suffix.begin(), tolower);
    }